

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O1

void test_common<float>(uint length,float value)

{
  float fVar1;
  bool bVar2;
  _func_int **pp_Var3;
  _Atomic_word _Var4;
  _Atomic_word _Var5;
  _Atomic_word _Var6;
  _Atomic_word _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  uint i;
  int iVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  ulong uVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  undefined8 *puVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  size_t __size;
  ulong uVar20;
  undefined4 in_XMM0_Db;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  shared_ptr<float> pa;
  shared_ptr<float> pb;
  
  pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = in_XMM0_Db;
  pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = value;
  __size = (long)(int)(length + 1) << 2;
  iVar10 = posix_memalign(&pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi,0x40,__size);
  local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar10 == 0) {
    local_68 = pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,local_68,sse::common::free<float>);
  iVar10 = posix_memalign(&local_70,0x40,__size);
  pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar10 == 0) {
    pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_70;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<float>);
  _Var9._M_pi = pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var8 = local_68;
  uVar20 = (ulong)length;
  *(undefined4 *)((long)&local_68->_vptr__Sp_counted_base + uVar20 * 4) = 0x42fe0000;
  *(undefined4 *)
   ((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar20 * 4) = 0x427c0000;
  p_Var11 = local_68;
  uVar16 = length;
  uVar15 = length;
  if (0xf < (int)length) {
    do {
      *(float *)&p_Var11->_vptr__Sp_counted_base =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)((long)&p_Var11->_vptr__Sp_counted_base + 4) =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var11->_M_use_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var11->_M_weak_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)&p_Var11[1]._vptr__Sp_counted_base =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)((long)&p_Var11[1]._vptr__Sp_counted_base + 4) =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var11[1]._M_use_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var11[1]._M_weak_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)&p_Var11[2]._vptr__Sp_counted_base =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)((long)&p_Var11[2]._vptr__Sp_counted_base + 4) =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var11[2]._M_use_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var11[2]._M_weak_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)&p_Var11[3]._vptr__Sp_counted_base =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)((long)&p_Var11[3]._vptr__Sp_counted_base + 4) =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var11[3]._M_use_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var11[3]._M_weak_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      uVar15 = uVar16 - 0x10;
      p_Var11 = p_Var11 + 4;
      bVar2 = 0x1f < (int)uVar16;
      uVar16 = uVar15;
    } while (bVar2);
  }
  if (7 < (int)uVar15) {
    *(float *)&p_Var11->_vptr__Sp_counted_base =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    *(float *)((long)&p_Var11->_vptr__Sp_counted_base + 4) =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var11->_M_use_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var11->_M_weak_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    *(float *)&p_Var11[1]._vptr__Sp_counted_base =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    *(float *)((long)&p_Var11[1]._vptr__Sp_counted_base + 4) =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var11[1]._M_use_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var11[1]._M_weak_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    uVar15 = uVar15 - 8;
    p_Var11 = p_Var11 + 2;
  }
  if (3 < (int)uVar15) {
    *(float *)&p_Var11->_vptr__Sp_counted_base =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    *(float *)((long)&p_Var11->_vptr__Sp_counted_base + 4) =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var11->_M_use_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var11->_M_weak_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    uVar15 = uVar15 - 4;
    p_Var11 = p_Var11 + 1;
  }
  if (0 < (int)uVar15) {
    iVar10 = uVar15 + 1;
    do {
      *(float *)&p_Var11->_vptr__Sp_counted_base =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var11->_vptr__Sp_counted_base + 4);
      iVar10 = iVar10 + -1;
    } while (1 < iVar10);
  }
  if (length != 0) {
    uVar12 = 0;
    do {
      fVar1 = *(float *)((long)&local_68->_vptr__Sp_counted_base + uVar12 * 4);
      if ((fVar1 != pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
          ) || (NAN(fVar1) ||
                NAN(pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
                   ))) {
        puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar14 = "void test_common(unsigned int, T) [T = float]";
        *(undefined4 *)(puVar14 + 1) = 0x16;
        *(uint *)((long)puVar14 + 0xc) = length;
        __cxa_throw(puVar14,&Exception::typeinfo,0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar20 != uVar12);
  }
  _Var13._M_pi = pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var11 = local_68;
  uVar15 = length;
  uVar16 = length;
  if (7 < (int)length) {
    do {
      _Var4 = p_Var11->_M_use_count;
      _Var5 = p_Var11->_M_weak_count;
      pp_Var3 = p_Var11[1]._vptr__Sp_counted_base;
      _Var6 = p_Var11[1]._M_use_count;
      _Var7 = p_Var11[1]._M_weak_count;
      (_Var13._M_pi)->_vptr__Sp_counted_base = p_Var11->_vptr__Sp_counted_base;
      (_Var13._M_pi)->_M_use_count = _Var4;
      (_Var13._M_pi)->_M_weak_count = _Var5;
      _Var13._M_pi[1]._vptr__Sp_counted_base = pp_Var3;
      _Var13._M_pi[1]._M_use_count = _Var6;
      _Var13._M_pi[1]._M_weak_count = _Var7;
      uVar16 = uVar15 - 8;
      p_Var11 = p_Var11 + 2;
      _Var13._M_pi = _Var13._M_pi + 2;
      bVar2 = 0xf < (int)uVar15;
      uVar15 = uVar16;
    } while (bVar2);
  }
  if (3 < (int)uVar16) {
    _Var4 = p_Var11->_M_use_count;
    _Var5 = p_Var11->_M_weak_count;
    (_Var13._M_pi)->_vptr__Sp_counted_base = p_Var11->_vptr__Sp_counted_base;
    (_Var13._M_pi)->_M_use_count = _Var4;
    (_Var13._M_pi)->_M_weak_count = _Var5;
    uVar16 = uVar16 - 4;
    p_Var11 = p_Var11 + 1;
    _Var13._M_pi = _Var13._M_pi + 1;
  }
  if (0 < (int)uVar16) {
    iVar10 = uVar16 + 1;
    lVar19 = 0;
    do {
      *(undefined4 *)((long)&(_Var13._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(undefined4 *)((long)&p_Var11->_vptr__Sp_counted_base + lVar19);
      lVar19 = lVar19 + 4;
      iVar10 = iVar10 + -1;
    } while (1 < iVar10);
  }
  if (length != 0) {
    uVar12 = 0;
    do {
      fVar1 = *(float *)((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar12 * 4);
      if ((fVar1 != pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
          ) || (NAN(fVar1) ||
                NAN(pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
                   ))) {
        puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar14 = "void test_common(unsigned int, T) [T = float]";
        *(undefined4 *)(puVar14 + 1) = 0x1d;
        *(uint *)((long)puVar14 + 0xc) = length;
        __cxa_throw(puVar14,&Exception::typeinfo,0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar20 != uVar12);
  }
  uVar12 = (ulong)length;
  _Var13._M_pi = pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar15 = length;
  if (0xf < (int)length) {
    uVar15 = 0x1f;
    if ((int)length < 0x1f) {
      uVar15 = length;
    }
    uVar16 = (length - uVar15) + 0xf;
    uVar18 = (ulong)(uVar16 >> 4);
    pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)length;
    memset(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,0,
           uVar18 * 0x40 + 0x40);
    uVar15 = (uint)pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    uVar12 = (ulong)((uVar15 - (uVar16 & 0xfffffff0)) - 0x10);
    _Var13._M_pi = _Var9._M_pi + uVar18 * 4 + 4;
  }
  if (7 < (int)uVar12) {
    uVar12 = (ulong)((int)uVar12 - 8);
    _Var13._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    _Var13._M_pi[1]._M_use_count = 0;
    _Var13._M_pi[1]._M_weak_count = 0;
    (_Var13._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
    (_Var13._M_pi)->_M_use_count = 0;
    (_Var13._M_pi)->_M_weak_count = 0;
    _Var13._M_pi = _Var13._M_pi + 2;
  }
  if (3 < (int)uVar12) {
    (_Var13._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
    (_Var13._M_pi)->_M_use_count = 0;
    (_Var13._M_pi)->_M_weak_count = 0;
    uVar12 = (ulong)((int)uVar12 - 4);
    _Var13._M_pi = _Var13._M_pi + 1;
  }
  if (0 < (int)uVar12) {
    memset(_Var13._M_pi,0,uVar12 << 2);
  }
  if (uVar15 != 0) {
    uVar12 = 0;
    do {
      fVar1 = *(float *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + uVar12 * 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar14 = "void test_common(unsigned int, T) [T = float]";
        *(undefined4 *)(puVar14 + 1) = 0x24;
        *(uint *)((long)puVar14 + 0xc) = uVar15;
        __cxa_throw(puVar14,&Exception::typeinfo,0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar20 != uVar12);
    uVar12 = 0;
    do {
      *(float *)((long)&p_Var8->_vptr__Sp_counted_base + uVar12 * 4) = (float)(uVar12 & 0xffffffff);
      uVar12 = uVar12 + 1;
    } while (uVar20 != uVar12);
  }
  _Var13._M_pi = _Var9._M_pi;
  p_Var11 = p_Var8;
  uVar16 = uVar15;
  uVar17 = uVar15;
  if (7 < (int)uVar15) {
    do {
      _Var4 = p_Var11->_M_use_count;
      _Var5 = p_Var11->_M_weak_count;
      pp_Var3 = p_Var11[1]._vptr__Sp_counted_base;
      _Var6 = p_Var11[1]._M_use_count;
      _Var7 = p_Var11[1]._M_weak_count;
      (_Var13._M_pi)->_vptr__Sp_counted_base = p_Var11->_vptr__Sp_counted_base;
      (_Var13._M_pi)->_M_use_count = _Var4;
      (_Var13._M_pi)->_M_weak_count = _Var5;
      _Var13._M_pi[1]._vptr__Sp_counted_base = pp_Var3;
      _Var13._M_pi[1]._M_use_count = _Var6;
      _Var13._M_pi[1]._M_weak_count = _Var7;
      uVar17 = uVar16 - 8;
      p_Var11 = p_Var11 + 2;
      _Var13._M_pi = _Var13._M_pi + 2;
      bVar2 = 0xf < (int)uVar16;
      uVar16 = uVar17;
    } while (bVar2);
  }
  if (3 < (int)uVar17) {
    _Var4 = p_Var11->_M_use_count;
    _Var5 = p_Var11->_M_weak_count;
    (_Var13._M_pi)->_vptr__Sp_counted_base = p_Var11->_vptr__Sp_counted_base;
    (_Var13._M_pi)->_M_use_count = _Var4;
    (_Var13._M_pi)->_M_weak_count = _Var5;
    uVar17 = uVar17 - 4;
    p_Var11 = p_Var11 + 1;
    _Var13._M_pi = _Var13._M_pi + 1;
  }
  if (0 < (int)uVar17) {
    iVar10 = uVar17 + 1;
    lVar19 = 0;
    do {
      *(undefined4 *)((long)&(_Var13._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(undefined4 *)((long)&p_Var11->_vptr__Sp_counted_base + lVar19);
      lVar19 = lVar19 + 4;
      iVar10 = iVar10 + -1;
    } while (1 < iVar10);
  }
  if (uVar15 != 0) {
    uVar12 = 0;
    do {
      fVar1 = *(float *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + uVar12 * 4);
      if ((fVar1 != (float)(uVar12 & 0xffffffff)) ||
         (NAN(fVar1) || NAN((float)(uVar12 & 0xffffffff)))) {
        puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar14 = "void test_common(unsigned int, T) [T = float]";
        *(undefined4 *)(puVar14 + 1) = 0x2d;
        *(uint *)((long)puVar14 + 0xc) = length;
        __cxa_throw(puVar14,&Exception::typeinfo,0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar20 != uVar12);
  }
  fVar1 = *(float *)((long)&p_Var8->_vptr__Sp_counted_base + uVar20 * 4);
  if ((((fVar1 == 127.0) && (!NAN(fVar1))) &&
      (fVar1 = *(float *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + uVar20 * 4), fVar1 == 63.0)
      ) && (!NAN(fVar1))) {
    if (pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar14 = "void test_common(unsigned int, T) [T = float]";
  *(undefined4 *)(puVar14 + 1) = 0x31;
  *(uint *)((long)puVar14 + 0xc) = uVar15;
  __cxa_throw(puVar14,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}